

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void capnp::compiler::findImports
               (Reader paramList,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  short sVar1;
  Reader exp;
  Reader exp_00;
  Reader exp_01;
  ListElementCount LVar2;
  ElementCount index;
  ElementCount index_00;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Reader param;
  Reader ann;
  StructReader local_1a8;
  StructReader local_178;
  PointerReader local_148;
  ListReader local_128;
  ListReader local_f8;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (0xf < paramList._reader.dataSize) {
    sVar1 = *paramList._reader.data;
    if (sVar1 == 2) {
      local_f8.segment = (SegmentReader *)0x57d1f1;
      local_f8.capTable = (CapTableReader *)0x14;
      std::
      _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
      ::_M_insert_unique<kj::StringPtr>(&output->_M_t,(StringPtr *)&local_f8);
      return;
    }
    if (sVar1 == 1) {
      bVar3 = paramList._reader.pointerCount == 0;
      local_f8.ptr = (byte *)paramList._reader.pointers;
      if (bVar3) {
        local_f8.ptr = (byte *)(WirePointer *)0x0;
      }
      local_f8.elementCount = 0x7fffffff;
      if (!bVar3) {
        local_f8.elementCount = paramList._reader.nestingLimit;
      }
      uVar4 = 0;
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      if (!bVar3) {
        uVar4 = paramList._reader.segment._0_4_;
        uVar5 = paramList._reader.segment._4_4_;
        uVar6 = paramList._reader.capTable._0_4_;
        uVar7 = paramList._reader.capTable._4_4_;
      }
      local_f8.segment = (SegmentReader *)CONCAT44(uVar5,uVar4);
      local_f8.capTable = (CapTableReader *)CONCAT44(uVar7,uVar6);
      capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_f8,(word *)0x0);
      exp_01._reader.capTable = local_60.capTable;
      exp_01._reader.segment = local_60.segment;
      exp_01._reader.data = local_60.data;
      exp_01._reader.pointers = local_60.pointers;
      exp_01._reader.dataSize = local_60.dataSize;
      exp_01._reader.pointerCount = local_60.pointerCount;
      exp_01._reader._38_2_ = local_60._38_2_;
      exp_01._reader.nestingLimit = local_60.nestingLimit;
      exp_01._reader._44_4_ = local_60._44_4_;
      findImports(exp_01,output);
      return;
    }
    if (sVar1 != 0) {
      return;
    }
  }
  bVar3 = paramList._reader.pointerCount == 0;
  local_1a8.data = paramList._reader.pointers;
  if (bVar3) {
    local_1a8.data = (WirePointer *)0x0;
  }
  local_1a8.pointers._0_4_ = 0x7fffffff;
  if (!bVar3) {
    local_1a8.pointers._0_4_ = paramList._reader.nestingLimit;
  }
  local_1a8.segment._0_4_ = 0;
  local_1a8.segment._4_4_ = 0;
  local_1a8.capTable._0_4_ = 0;
  local_1a8.capTable._4_4_ = 0;
  if (!bVar3) {
    local_1a8.segment._0_4_ = paramList._reader.segment._0_4_;
    local_1a8.segment._4_4_ = paramList._reader.segment._4_4_;
    local_1a8.capTable._0_4_ = paramList._reader.capTable._0_4_;
    local_1a8.capTable._4_4_ = paramList._reader.capTable._4_4_;
  }
  capnp::_::PointerReader::getList
            (&local_f8,(PointerReader *)&local_1a8,INLINE_COMPOSITE,(word *)0x0);
  if (local_f8.elementCount != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_1a8,&local_f8,index);
      local_128.ptr = (byte *)(CONCAT44(local_1a8.pointers._4_4_,(int)local_1a8.pointers) + 8);
      if (local_1a8.pointerCount < 2) {
        local_128.ptr = (byte *)0x0;
      }
      local_128.segment._0_4_ = local_1a8.segment._0_4_;
      local_128.segment._4_4_ = local_1a8.segment._4_4_;
      local_128.capTable._0_4_ = local_1a8.capTable._0_4_;
      local_128.capTable._4_4_ = local_1a8.capTable._4_4_;
      local_128.elementCount = local_1a8.nestingLimit;
      if (local_1a8.pointerCount < 2) {
        local_128.segment._0_4_ = 0;
        local_128.segment._4_4_ = 0;
        local_128.capTable._0_4_ = 0;
        local_128.capTable._4_4_ = 0;
        local_128.elementCount = 0x7fffffff;
      }
      capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)&local_128,(word *)0x0);
      exp._reader.capTable = local_90.capTable;
      exp._reader.segment = local_90.segment;
      exp._reader.data = local_90.data;
      exp._reader.pointers = local_90.pointers;
      exp._reader.dataSize = local_90.dataSize;
      exp._reader.pointerCount = local_90.pointerCount;
      exp._reader._38_2_ = local_90._38_2_;
      exp._reader.nestingLimit = local_90.nestingLimit;
      exp._reader._44_4_ = local_90._44_4_;
      findImports(exp,output);
      local_178.data = (void *)(CONCAT44(local_1a8.pointers._4_4_,(int)local_1a8.pointers) + 0x10);
      local_178.segment._0_4_ = local_1a8.segment._0_4_;
      local_178.segment._4_4_ = local_1a8.segment._4_4_;
      local_178.capTable._0_4_ = local_1a8.capTable._0_4_;
      local_178.capTable._4_4_ = local_1a8.capTable._4_4_;
      local_178.pointers._0_4_ = local_1a8.nestingLimit;
      if (local_1a8.pointerCount < 3) {
        local_178.segment._0_4_ = 0;
        local_178.segment._4_4_ = 0;
        local_178.capTable._0_4_ = 0;
        local_178.capTable._4_4_ = 0;
        local_178.data = (void *)0x0;
        local_178.pointers._0_4_ = 0x7fffffff;
      }
      capnp::_::PointerReader::getList
                (&local_128,(PointerReader *)&local_178,INLINE_COMPOSITE,(word *)0x0);
      LVar2 = local_128.elementCount;
      if (local_128.elementCount != 0) {
        index_00 = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_178,&local_128,index_00);
          local_148.pointer =
               (WirePointer *)CONCAT44(local_178.pointers._4_4_,(ElementCount)local_178.pointers);
          local_148.nestingLimit = local_178.nestingLimit;
          if (local_178.pointerCount == 0) {
            local_148.pointer = (WirePointer *)0x0;
            local_148.nestingLimit = 0x7fffffff;
          }
          local_148.segment._0_4_ = 0;
          local_148.segment._4_4_ = 0;
          local_148.capTable._0_4_ = 0;
          local_148.capTable._4_4_ = 0;
          if (local_178.pointerCount != 0) {
            local_148.segment._0_4_ = local_178.segment._0_4_;
            local_148.segment._4_4_ = local_178.segment._4_4_;
            local_148.capTable._0_4_ = local_178.capTable._0_4_;
            local_148.capTable._4_4_ = local_178.capTable._4_4_;
          }
          capnp::_::PointerReader::getStruct(&local_c0,&local_148,(word *)0x0);
          exp_00._reader.capTable = local_c0.capTable;
          exp_00._reader.segment = local_c0.segment;
          exp_00._reader.data = local_c0.data;
          exp_00._reader.pointers = local_c0.pointers;
          exp_00._reader.dataSize = local_c0.dataSize;
          exp_00._reader.pointerCount = local_c0.pointerCount;
          exp_00._reader._38_2_ = local_c0._38_2_;
          exp_00._reader.nestingLimit = local_c0.nestingLimit;
          exp_00._reader._44_4_ = local_c0._44_4_;
          findImports(exp_00,output);
          index_00 = index_00 + 1;
        } while (LVar2 != index_00);
      }
      index = index + 1;
    } while (index != local_f8.elementCount);
  }
  return;
}

Assistant:

static void findImports(Declaration::ParamList::Reader paramList, std::set<kj::StringPtr>& output) {
  switch (paramList.which()) {
    case Declaration::ParamList::NAMED_LIST:
      for (auto param: paramList.getNamedList()) {
        findImports(param.getType(), output);
        for (auto ann: param.getAnnotations()) {
          findImports(ann.getName(), output);
        }
      }
      break;
    case Declaration::ParamList::TYPE:
      findImports(paramList.getType(), output);
      break;
    case Declaration::ParamList::STREAM:
      output.insert("/capnp/stream.capnp");
      break;
  }
}